

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Resolution * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResolutionAtReturnTime
          (Resolution *__return_storage_ptr__,RpcServerResponseImpl *this,
          ArrayPtr<const_capnp::PipelineOp> ops)

{
  ArrayPtr<const_capnp::PipelineOp> ops_00;
  Own<capnp::ClientHook,_std::nullptr_t> returnedCap;
  undefined1 local_80 [16];
  PointerBuilder local_70;
  size_t local_50;
  PointerBuilder local_48;
  
  local_50 = ops.size_;
  ops_00.size_ = ops.ptr;
  local_70.segment = (this->payload)._builder.segment;
  local_70.capTable = (this->payload)._builder.capTable;
  local_70.pointer = (this->payload)._builder.pointers;
  PointerBuilder::imbue
            (&local_48,(PointerBuilder *)(local_80 + 0x10),&(this->capTable).super_CapTableBuilder);
  PointerBuilder::asReader(&local_48);
  ops_00.ptr = (PipelineOp *)(local_80 + 0x10);
  AnyPointer::Reader::getPipelinedCap((Reader *)local_80,ops_00);
  local_48.segment = (SegmentBuilder *)local_80._8_8_;
  kj::
  Table<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>>
  ::find<0ul,capnp::ClientHook*&>
            ((Table<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>>
              *)(local_80 + 0x10),(ClientHook **)&this->resolutionsAtReturnTime);
  if (local_70.segment == (SegmentBuilder *)0x0) {
    (*(code *)((SegmentReader *)local_80._8_8_)->arena[4]._vptr_Arena)(local_80 + 0x10);
  }
  else {
    (**(code **)((((local_70.segment)->super_SegmentReader).ptr.ptr)->content + 0x20))
              (local_80 + 0x10);
  }
  (__return_storage_ptr__->returnedCap).disposer = (Disposer *)local_80._0_8_;
  (__return_storage_ptr__->returnedCap).ptr = (ClientHook *)local_80._8_8_;
  (__return_storage_ptr__->unwrapped).disposer = (Disposer *)local_70.segment;
  (__return_storage_ptr__->unwrapped).ptr = (ClientHook *)local_70.capTable;
  return __return_storage_ptr__;
}

Assistant:

Resolution getResolutionAtReturnTime(kj::ArrayPtr<const PipelineOp> ops) {
      auto returnedCap = getResultsBuilder().asReader().getPipelinedCap(ops);
      kj::Own<ClientHook> unwrapped;
      KJ_IF_SOME(u, resolutionsAtReturnTime.find(returnedCap.get())) {
        unwrapped = u->addRef();
      } else {
        unwrapped = returnedCap->addRef();
      }